

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall ParserTest_temp_parser_Test::TestBody(ParserTest_temp_parser_Test *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  AssertHelper local_610 [8];
  Message local_608 [16];
  format_not_available *anon_var_0_3;
  type e_5;
  string local_5c8 [32];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_5a8;
  object local_598;
  byte local_549;
  undefined1 auStack_548 [7];
  bool gtest_caught_expected_3;
  TrueWithString gtest_msg_5;
  AssertHelper local_520 [8];
  Message local_518 [16];
  format_not_available *anon_var_0_2;
  type e_4;
  string local_4d8 [32];
  object local_4b8;
  undefined1 local_470 [47];
  bool gtest_caught_expected_2;
  TrueWithString gtest_msg_4;
  AssertHelper local_408 [8];
  Message local_400 [48];
  exception *e_3;
  string local_3c8 [32];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_3a8;
  object local_398;
  undefined1 auStack_358 [8];
  TrueWithString gtest_msg_3;
  AssertHelper local_318 [8];
  Message local_310 [48];
  exception *e_2;
  string local_2d8 [32];
  object local_2b8;
  undefined1 local_278 [40];
  TrueWithString gtest_msg_2;
  allocator<char> local_229;
  string local_228;
  parser_registration<test_parser> local_208;
  parser_registration<test_parser> test_tmp_registration;
  Message local_1f8 [16];
  format_not_available *anon_var_0_1;
  type e_1;
  string local_1b8 [32];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_198;
  object local_188;
  byte local_139;
  undefined1 auStack_138 [7];
  bool gtest_caught_expected_1;
  TrueWithString gtest_msg_1;
  AssertHelper local_110 [8];
  Message local_108 [16];
  format_not_available *anon_var_0;
  type e;
  string local_c8 [32];
  object local_a8;
  undefined1 local_68 [43];
  bool gtest_caught_expected;
  undefined1 auStack_38 [8];
  TrueWithString gtest_msg;
  ParserTest_temp_parser_Test *this_local;
  
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_38 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus._M_p = (pointer)0x0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_38);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_38);
  if (bVar1) {
    local_68[0x23] = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2 & 1) != 0) {
      jessilib::object::object(&local_a8,(uchar *)"test_data");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_c8,"test_tmp",(allocator<char> *)((long)&e + 7));
      jessilib::serialize_object((object *)local_68,(string *)&local_a8);
      std::__cxx11::u8string::~u8string((u8string *)local_68);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
      jessilib::object::~object(&local_a8);
    }
    if ((local_68[0x23] & 1) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_38,
                 "Expected: serialize_object(u8\"test_data\", \"test_tmp\") throws an exception of type format_not_available.\n  Actual: it throws nothing."
                );
      goto LAB_002feea5;
    }
  }
  else {
LAB_002feea5:
    testing::Message::Message(local_108);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        auStack_38);
    testing::internal::AssertHelper::AssertHelper
              (local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parser.cpp"
               ,0x93,pcVar3);
    testing::internal::AssertHelper::operator=(local_110,local_108);
    testing::internal::AssertHelper::~AssertHelper(local_110);
    testing::Message::~Message(local_108);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_38);
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  _auStack_138 = (pointer)0x0;
  gtest_msg_1.value._M_dataplus._M_p = (pointer)0x0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_138);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_138);
  if (bVar1) {
    local_139 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2 & 1) != 0) {
      local_198 = sv("test_data",9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1b8,"test_tmp",(allocator<char> *)((long)&e_1 + 7));
      jessilib::deserialize_object(&local_188,local_198._M_len,local_198._M_str,local_1b8);
      jessilib::object::~object(&local_188);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e_1 + 7));
    }
    if ((local_139 & 1) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_138,
                 "Expected: deserialize_object(u8\"test_data\"sv, \"test_tmp\") throws an exception of type format_not_available.\n  Actual: it throws nothing."
                );
      goto LAB_002ff267;
    }
  }
  else {
LAB_002ff267:
    testing::Message::Message(local_1f8);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        auStack_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_tmp_registration,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parser.cpp"
               ,0x94,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&test_tmp_registration,local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_tmp_registration);
    testing::Message::~Message(local_1f8);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"test_tmp",&local_229);
  jessilib::parser_registration<test_parser>::parser_registration(&local_208,&local_228,false);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  gtest_msg_2.value._M_string_length = 0;
  gtest_msg_2.value.field_2._M_allocated_capacity = 0;
  local_278._32_8_ = 0;
  gtest_msg_2.value._M_dataplus._M_p = (pointer)0x0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)(local_278 + 0x20));
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool
                    ((TrueWithString *)(local_278 + 0x20));
  if (bVar1) {
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2 & 1) != 0) {
      jessilib::object::object(&local_2b8,(uchar *)"test_data");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_2d8,"test_tmp",(allocator<char> *)((long)&e_2 + 7));
      jessilib::serialize_object((object *)local_278,(string *)&local_2b8);
      std::__cxx11::u8string::~u8string((u8string *)local_278);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e_2 + 7));
      jessilib::object::~object(&local_2b8);
    }
  }
  else {
    testing::Message::Message(local_310);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_3.value.field_2 + 8),
                   "Expected: serialize_object(u8\"test_data\", \"test_tmp\") doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_278 + 0x20));
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&gtest_msg_3.value.field_2 + 8));
    testing::internal::AssertHelper::AssertHelper
              (local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parser.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=(local_318,local_310);
    testing::internal::AssertHelper::~AssertHelper(local_318);
    std::__cxx11::string::~string((string *)(gtest_msg_3.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_310);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)(local_278 + 0x20));
  gtest_msg_3.value._M_string_length = 0;
  gtest_msg_3.value.field_2._M_allocated_capacity = 0;
  auStack_358 = (undefined1  [8])0x0;
  gtest_msg_3.value._M_dataplus._M_p = (pointer)0x0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_358);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_358);
  if (bVar1) {
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2 & 1) != 0) {
      local_3a8 = sv("test_data",9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_3c8,"test_tmp",(allocator<char> *)((long)&e_3 + 7));
      jessilib::deserialize_object(&local_398,local_3a8._M_len,local_3a8._M_str,local_3c8);
      jessilib::object::~object(&local_398);
      std::__cxx11::string::~string(local_3c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e_3 + 7));
    }
  }
  else {
    testing::Message::Message(local_400);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_4.value.field_2 + 8),
                   "Expected: deserialize_object(u8\"test_data\"sv, \"test_tmp\") doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_358
                  );
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&gtest_msg_4.value.field_2 + 8));
    testing::internal::AssertHelper::AssertHelper
              (local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parser.cpp"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=(local_408,local_400);
    testing::internal::AssertHelper::~AssertHelper(local_408);
    std::__cxx11::string::~string((string *)(gtest_msg_4.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_400);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_358);
  jessilib::parser_registration<test_parser>::~parser_registration(&local_208);
  gtest_msg_4.value._M_string_length = 0;
  gtest_msg_4.value.field_2._M_allocated_capacity = 0;
  stack0xfffffffffffffbb8 = 0;
  gtest_msg_4.value._M_dataplus._M_p = (pointer)0x0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)(local_470 + 0x28));
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool
                    ((TrueWithString *)(local_470 + 0x28));
  if (bVar1) {
    local_470[0x27] = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2 & 1) != 0) {
      jessilib::object::object(&local_4b8,(uchar *)"test_data");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_4d8,"test_tmp",(allocator<char> *)((long)&e_4 + 7));
      jessilib::serialize_object((object *)local_470,(string *)&local_4b8);
      std::__cxx11::u8string::~u8string((u8string *)local_470);
      std::__cxx11::string::~string(local_4d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e_4 + 7));
      jessilib::object::~object(&local_4b8);
    }
    if ((local_470[0x27] & 1) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_470 + 0x28),
                 "Expected: serialize_object(u8\"test_data\", \"test_tmp\") throws an exception of type format_not_available.\n  Actual: it throws nothing."
                );
      goto LAB_002ffe3b;
    }
  }
  else {
LAB_002ffe3b:
    testing::Message::Message(local_518);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_470 + 0x28));
    testing::internal::AssertHelper::AssertHelper
              (local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parser.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(local_520,local_518);
    testing::internal::AssertHelper::~AssertHelper(local_520);
    testing::Message::~Message(local_518);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)(local_470 + 0x28));
  gtest_msg_5.value._M_string_length = 0;
  gtest_msg_5.value.field_2._M_allocated_capacity = 0;
  _auStack_548 = (pointer)0x0;
  gtest_msg_5.value._M_dataplus._M_p = (pointer)0x0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_548);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_548);
  if (bVar1) {
    local_549 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2 & 1) != 0) {
      local_5a8 = sv("test_data",9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_5c8,"test_tmp",(allocator<char> *)((long)&e_5 + 7));
      jessilib::deserialize_object(&local_598,local_5a8._M_len,local_5a8._M_str,local_5c8);
      jessilib::object::~object(&local_598);
      std::__cxx11::string::~string(local_5c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e_5 + 7));
    }
    if ((local_549 & 1) != 0) goto LAB_003002a5;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_548,
               "Expected: deserialize_object(u8\"test_data\"sv, \"test_tmp\") throws an exception of type format_not_available.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_608);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_548);
  testing::internal::AssertHelper::AssertHelper
            (local_610,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parser.cpp"
             ,0x9d,pcVar3);
  testing::internal::AssertHelper::operator=(local_610,local_608);
  testing::internal::AssertHelper::~AssertHelper(local_610);
  testing::Message::~Message(local_608);
LAB_003002a5:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_548);
  return;
}

Assistant:

TEST_F(ParserTest, temp_parser) {
	EXPECT_THROW(serialize_object(u8"test_data", "test_tmp"), format_not_available);
	EXPECT_THROW(deserialize_object(u8"test_data"sv, "test_tmp"), format_not_available);

	{
		parser_registration<test_parser> test_tmp_registration{ "test_tmp" };
		EXPECT_NO_THROW(serialize_object(u8"test_data", "test_tmp"));
		EXPECT_NO_THROW(deserialize_object(u8"test_data"sv, "test_tmp"));
	}

	EXPECT_THROW(serialize_object(u8"test_data", "test_tmp"), format_not_available);
	EXPECT_THROW(deserialize_object(u8"test_data"sv, "test_tmp"), format_not_available);
}